

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfPub.c
# Opt level: O0

void sbfPub_destroy(sbfPub pub)

{
  undefined8 uVar1;
  char *pcVar2;
  undefined8 *in_RDI;
  
  if (*(int *)(in_RDI + 1) == 0) {
    *(undefined4 *)(in_RDI + 1) = 1;
    uVar1 = *(undefined8 *)(in_RDI[3] + 8);
    pcVar2 = sbfTopic_getTopic((sbfTopic)*in_RDI);
    sbfLog_log(uVar1,0,"queueing remove of publisher %p (%s)",in_RDI,pcVar2);
    sbfMw_enqueueThread(*(undefined8 *)(in_RDI[4] + 8),in_RDI + 0x19,sbfPubRemoveEventCb,in_RDI);
  }
  return;
}

Assistant:

void
sbfPub_destroy (sbfPub pub)
{
    if (pub->mDestroyed)
        return;
    pub->mDestroyed = 1;

    sbfLog_debug (pub->mTport->mLog,
                  "queueing remove of publisher %p (%s)",
                  pub,
                  sbfTopic_getTopic (pub->mTopic));

    sbfMw_enqueueThread (pub->mTportStream->mThread,
                         &pub->mEventRemove,
                         sbfPubRemoveEventCb,
                         pub);
}